

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O1

SUNLinearSolver SUNLinSol_Dense(N_Vector y,SUNMatrix A,SUNContext sunctx)

{
  SUNLinearSolver_Ops p_Var1;
  SUNMatrix_ID SVar2;
  sunindextype sVar3;
  sunindextype sVar4;
  N_Vector_ID NVar5;
  SUNLinearSolver S;
  sunindextype *psVar6;
  void *pvVar7;
  
  SVar2 = SUNMatGetID(A);
  if (SVar2 == SUNMATRIX_DENSE) {
    sVar3 = SUNDenseMatrix_Rows(A);
    sVar4 = SUNDenseMatrix_Columns(A);
    if ((sVar3 == sVar4) &&
       (((NVar5 = N_VGetVectorID(y), NVar5 == SUNDIALS_NVEC_SERIAL ||
         (NVar5 = N_VGetVectorID(y), NVar5 == SUNDIALS_NVEC_OPENMP)) ||
        (NVar5 = N_VGetVectorID(y), NVar5 == SUNDIALS_NVEC_PTHREADS)))) {
      sVar3 = SUNDenseMatrix_Rows(A);
      sVar4 = N_VGetLength(y);
      if ((sVar3 == sVar4) && (S = SUNLinSolNewEmpty(sunctx), S != (SUNLinearSolver)0x0)) {
        p_Var1 = S->ops;
        p_Var1->gettype = SUNLinSolGetType_Dense;
        p_Var1->getid = SUNLinSolGetID_Dense;
        p_Var1->initialize = SUNLinSolInitialize_Dense;
        p_Var1->setup = SUNLinSolSetup_Dense;
        p_Var1->solve = SUNLinSolSolve_Dense;
        p_Var1->lastflag = SUNLinSolLastFlag_Dense;
        p_Var1->space = SUNLinSolSpace_Dense;
        p_Var1->free = SUNLinSolFree_Dense;
        psVar6 = (sunindextype *)malloc(0x18);
        if (psVar6 != (sunindextype *)0x0) {
          S->content = psVar6;
          *psVar6 = sVar3;
          psVar6[4] = 0;
          psVar6[2] = 0;
          psVar6[3] = 0;
          pvVar7 = malloc((long)sVar3 << 2);
          *(void **)(psVar6 + 2) = pvVar7;
          if (pvVar7 != (void *)0x0) {
            return S;
          }
        }
        SUNLinSolFree(S);
      }
    }
  }
  return (SUNLinearSolver)0x0;
}

Assistant:

SUNLinearSolver SUNLinSol_Dense(N_Vector y, SUNMatrix A, SUNContext sunctx)
{
  SUNLinearSolver S;
  SUNLinearSolverContent_Dense content;
  sunindextype MatrixRows;

  /* Check compatibility with supplied SUNMatrix and N_Vector */
  if (SUNMatGetID(A) != SUNMATRIX_DENSE) return(NULL);

  if (SUNDenseMatrix_Rows(A) != SUNDenseMatrix_Columns(A)) return(NULL);

  if ( (N_VGetVectorID(y) != SUNDIALS_NVEC_SERIAL) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_OPENMP) &&
       (N_VGetVectorID(y) != SUNDIALS_NVEC_PTHREADS) )
    return(NULL);

  MatrixRows = SUNDenseMatrix_Rows(A);
  if (MatrixRows != N_VGetLength(y)) return(NULL);

  /* Create an empty linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  if (S == NULL) return(NULL);

  /* Attach operations */
  S->ops->gettype    = SUNLinSolGetType_Dense;
  S->ops->getid      = SUNLinSolGetID_Dense;
  S->ops->initialize = SUNLinSolInitialize_Dense;
  S->ops->setup      = SUNLinSolSetup_Dense;
  S->ops->solve      = SUNLinSolSolve_Dense;
  S->ops->lastflag   = SUNLinSolLastFlag_Dense;
  S->ops->space      = SUNLinSolSpace_Dense;
  S->ops->free       = SUNLinSolFree_Dense;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_Dense) malloc(sizeof *content);
  if (content == NULL) { SUNLinSolFree(S); return(NULL); }

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->N         = MatrixRows;
  content->last_flag = 0;
  content->pivots    = NULL;

  /* Allocate content */
  content->pivots = (sunindextype *) malloc(MatrixRows * sizeof(sunindextype));
  if (content->pivots == NULL) { SUNLinSolFree(S); return(NULL); }

  return(S);
}